

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

bool __thiscall CLOptions::ParseCommandLine(CLOptions *this,int argc,char **argv)

{
  char *__s;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  CLOptions *this_00;
  pointer pcVar4;
  int option_index;
  string opt_name;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  short_to_long_map;
  string short_opts;
  string opt_val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  allocator local_169;
  int local_168;
  int local_164;
  undefined1 local_160 [32];
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  char **local_110;
  string local_108;
  int local_e8;
  undefined4 uStack_e4;
  undefined1 local_d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_a8;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_168 = argc;
  local_110 = argv;
  DefineParams(this);
  if ((this->configfile_opt_name)._M_string_length != 0) {
    do {
      do {
        local_108._M_dataplus._M_p._0_4_ = 0xffffffff;
        iVar3 = getopt_long_only(local_168,local_110,"",
                                 (this->longopts).
                                 super__Vector_base<option,_std::allocator<option>_>._M_impl.
                                 super__Vector_impl_data._M_start,&local_108);
      } while (iVar3 == 0);
      if (iVar3 == -1) {
        pcVar4 = (this->configfile_opt_name)._M_dataplus._M_p;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar4,pcVar4 + (this->configfile_opt_name)._M_string_length)
        ;
        operator[]((string *)&local_140,this,&local_68);
        if ((_Base_ptr *)local_140._M_impl._0_8_ !=
            &local_140._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_140._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if (local_140._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) goto LAB_001087d9;
        pcVar4 = (this->configfile_opt_name)._M_dataplus._M_p;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar4,pcVar4 + (this->configfile_opt_name)._M_string_length)
        ;
        operator[]((string *)&local_140,this,&local_88);
        bVar2 = FillFromFile(this,(string *)&local_140);
        if ((_Base_ptr *)local_140._M_impl._0_8_ !=
            &local_140._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_140._M_impl._0_8_);
        }
        local_140._M_impl._0_8_ = local_88._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_001086de;
        goto LAB_001086e3;
      }
      std::__cxx11::string::string
                ((string *)&local_140,
                 (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)(_Rb_tree_color)local_108._M_dataplus._M_p].
                 name,(allocator *)local_160);
      iVar3 = std::__cxx11::string::compare((string *)&local_140);
      if ((_Base_ptr *)local_140._M_impl._0_8_ !=
          &local_140._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_140._M_impl._0_8_);
      }
    } while (iVar3 != 0);
    std::__cxx11::string::string((string *)&local_140,_optarg,(allocator *)local_160);
    bVar2 = FillFromFile(this,(string *)&local_140);
    if ((_Base_ptr *)local_140._M_impl._0_8_ !=
        &local_140._M_impl.super__Rb_tree_header._M_header._M_parent) {
LAB_001086de:
      operator_delete((void *)local_140._M_impl._0_8_);
    }
LAB_001086e3:
    if (bVar2 != false) {
      return true;
    }
  }
LAB_001087d9:
  _optind = 0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  GetShortOpts((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_140,this,&local_108);
LAB_00108833:
  pcVar4 = local_160 + 0x10;
  local_164 = -1;
  iVar3 = getopt_long(local_168,local_110,local_108._M_dataplus._M_p,
                      (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                      super__Vector_impl_data._M_start,&local_164);
  if (iVar3 < 0x3f) goto code_r0x0010885c;
  if (iVar3 != 0x3f) {
    if (iVar3 == 0x68) {
      std::__cxx11::string::string((string *)local_160,*local_110,(allocator *)&local_e8);
      PrintHelp(this,(string *)local_160);
LAB_00108a14:
      if ((pointer)local_160._0_8_ != pcVar4) {
        operator_delete((void *)local_160._0_8_);
      }
      goto LAB_00108a23;
    }
    if (iVar3 == 0x76) {
      this_00 = (CLOptions *)local_160;
      pcVar1 = (this->version_opt).
               super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .value._M_dataplus._M_p;
      local_160._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)this_00,pcVar1,
                 pcVar1 + (this->version_opt).
                          super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .value._M_string_length);
      PrintDescription(this_00,(string *)local_160,0);
      goto LAB_00108a14;
    }
    goto LAB_00108885;
  }
LAB_00108a23:
  bVar2 = true;
  goto LAB_00108a26;
code_r0x0010885c:
  if (iVar3 != 0) {
    if (iVar3 == -1) {
      bVar2 = false;
LAB_00108a26:
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      return bVar2;
    }
LAB_00108885:
    local_160._8_8_ = (pointer)0x0;
    local_160[0x10] = '\0';
    if ((long)local_164 < 0) {
      local_e8 = (int)(char)iVar3;
      local_160._0_8_ = pcVar4;
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_140,&local_e8);
      std::__cxx11::string::_M_assign((string *)local_160);
    }
    else {
      __s = (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
            super__Vector_impl_data._M_start[local_164].name;
      local_160._0_8_ = pcVar4;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)local_160,0,(char *)0x0,(ulong)__s);
    }
    std::__cxx11::string::string((string *)&local_e8,_optarg,(allocator *)&local_a8);
    std::__cxx11::string::string((string *)&local_a8,_optarg,&local_169);
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CLOptionsHelper::split(&local_a8,' ',&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&local_c8);
    SetParam(this,(string *)local_160,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if ((undefined1 *)CONCAT44(uStack_e4,local_e8) != local_d8) {
      operator_delete((undefined1 *)CONCAT44(uStack_e4,local_e8));
    }
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_);
    }
  }
  goto LAB_00108833;
}

Assistant:

bool CLOptions::ParseCommandLine(int argc, char** argv)
{
    // Establish the actual parameters
    DefineParams() ;

    // If we've defined a configuration file parameter, do a pre-loop to see if
    // the user has passed that parameter
    if (configfile_opt_name.size() > 0) {
        // Loop until we find the config file name
        bool use_default_configfile(true) ;
        while(1) {
            int c(0), options_index(-1) ;
            
            c = getopt_long_only(argc, argv, "",
                                 &longopts[0], &options_index) ;
            if (c==-1) break;
            if (c==0) continue ;
            if (std::string(longopts[options_index].name).compare(configfile_opt_name)==0) {
                if (FillFromFile(optarg)) return true ;
                use_default_configfile = false ;
                break ;
            }
        }
        // If the config file info wasnt filled AND if the default filename isnt empty
        // fill the config options from the default file
        if ((use_default_configfile)&&(!(*this)[configfile_opt_name].empty())) {
            if (FillFromFile((*this)[configfile_opt_name])) return true ;
        }
    }
    
    // Reset the option index so that we can start over filling the options
    // that were passed on the command line
    optind = 0 ;
    
    std::string short_opts ;
    std::map<int, std::string> short_to_long_map = GetShortOpts(short_opts) ;

    // Loop through all the passed options
    while (1)
    {
        int c(0) ;

        /* getopt_long stores the option index here. */
        int option_index = -1;
                
        // If short form options were given, then enforce the "double-dash" policy
        // for long options
        c = getopt_long (argc, argv, short_opts.c_str(),
                         &longopts[0], &option_index);
        
        /* Detect the end of the options. */
        if (c == -1) break;
        
        // Now loop through all of the options to fill them based on their values
        switch (c)
        {
            case 0:
                /* If this option set a flag, do nothing else now. */
                break;
            case 'h':
                // Print the help message and quit
                PrintHelp(argv[0]) ;
                return true ;
            case 'v':
                // Print the version information
                PrintDescription(version_opt.getValue(), 0) ;
                return true ;
            case '?':
                // getopt_long already printed an error message. This will
                // most typically happen when an unrecognized option has 
                // been passed, or when an option expecting an argument 
                // was not given one on the commandline.
                return true ;
            default:
                // We have found an option, so get the option name
                std::string opt_name ;
                if (option_index >= 0) {
                    // The long form of the name was supplied
                    opt_name = longopts[option_index].name ;
                } else {
                    // The short form of the name was supplied
                    char c_char(c) ;
                    opt_name = short_to_long_map[c_char] ;
                }
                std::string opt_val ( optarg ) ;
                std::vector<std::string> values = CLOptionsHelper::split( optarg, ' ') ;
                SetParam(opt_name, values) ;
                
                break ;
        }
    }
    // Note that it is up to the user to handle conflicts between parameters
    return false ;
}